

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * QuaternionToMatrix(Matrix *__return_storage_ptr__,Quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  fVar10 = q.x;
  fVar5 = q.y;
  fVar4 = fVar5 * fVar5 + fVar5 * fVar5;
  fVar9 = q.z;
  fVar3 = q.w;
  fVar2 = fVar9 * fVar9 + fVar9 * fVar9;
  fVar8 = fVar10 * fVar5 + fVar10 * fVar5;
  fVar6 = fVar10 * fVar9 + fVar10 * fVar9;
  fVar7 = fVar5 * fVar9 + fVar5 * fVar9;
  fVar1 = fVar10 * fVar3 + fVar10 * fVar3;
  fVar5 = fVar5 * fVar3 + fVar5 * fVar3;
  fVar9 = fVar3 * fVar9 + fVar3 * fVar9;
  __return_storage_ptr__->m0 = (1.0 - fVar4) - fVar2;
  __return_storage_ptr__->m1 = fVar8 - fVar9;
  __return_storage_ptr__->m2 = fVar6 + fVar5;
  __return_storage_ptr__->m4 = fVar9 + fVar8;
  fVar10 = 1.0 - (fVar10 * fVar10 + fVar10 * fVar10);
  __return_storage_ptr__->m5 = fVar10 - fVar2;
  __return_storage_ptr__->m6 = fVar7 - fVar1;
  __return_storage_ptr__->m8 = fVar6 - fVar5;
  __return_storage_ptr__->m9 = fVar1 + fVar7;
  __return_storage_ptr__->m10 = fVar10 - fVar4;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix QuaternionToMatrix(Quaternion q)
{
    Matrix result = MatrixIdentity();

    float a2 = 2*(q.x*q.x), b2=2*(q.y*q.y), c2=2*(q.z*q.z); //, d2=2*(q.w*q.w);

    float ab = 2*(q.x*q.y), ac=2*(q.x*q.z), bc=2*(q.y*q.z);
    float ad = 2*(q.x*q.w), bd=2*(q.y*q.w), cd=2*(q.z*q.w);

    result.m0 = 1 - b2 - c2;
    result.m1 = ab - cd;
    result.m2 = ac + bd;

    result.m4 = ab + cd;
    result.m5 = 1 - a2 - c2;
    result.m6 = bc - ad;

    result.m8 = ac - bd;
    result.m9 = bc + ad;
    result.m10 = 1 - a2 - b2;

    return result;
}